

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

bool check_single(char *chesses,int row,int col,int diff_row,int diff_col)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  char cVar9;
  bool bVar10;
  
  iVar1 = col + row * 0xf + -0x10;
  uVar2 = (((col + row * 0xf) - diff_col) + diff_row * -0xf) - 0x10;
  uVar7 = (col + -0x10) - diff_col;
  uVar4 = (row - diff_row) - 0x10;
  iVar6 = 1;
  lVar8 = 3;
  do {
    if ((((uVar4 < 0xfffffff1) || (uVar7 < 0xfffffff1)) || (chesses[iVar1] == '\0')) ||
       (chesses[uVar2] == '\0')) break;
    cVar5 = chesses[iVar1] % '\x02';
    cVar9 = chesses[uVar2] % '\x02';
    iVar6 = iVar6 + (uint)(cVar5 == cVar9);
    bVar10 = lVar8 != 0;
    lVar8 = lVar8 + -1;
    if (cVar5 != cVar9) break;
    uVar2 = uVar2 - (diff_row * 0xf + diff_col);
    uVar7 = uVar7 - diff_col;
    uVar4 = uVar4 - diff_row;
  } while (bVar10);
  iVar3 = diff_row * 0xf + diff_col;
  uVar4 = (row * 0x10 + iVar3) - 0x10;
  uVar7 = (diff_col + row) - 0x10;
  uVar2 = (row + diff_row) - 0x10;
  lVar8 = 3;
  do {
    if (((uVar2 < 0xfffffff1) || (uVar7 < 0xfffffff1)) ||
       ((chesses[iVar1] == '\0' || (chesses[uVar4] == '\0')))) break;
    cVar5 = chesses[iVar1] % '\x02';
    cVar9 = chesses[uVar4] % '\x02';
    iVar6 = iVar6 + (uint)(cVar5 == cVar9);
    bVar10 = lVar8 != 0;
    lVar8 = lVar8 + -1;
    if (cVar5 != cVar9) break;
    uVar4 = uVar4 + iVar3;
    uVar7 = uVar7 + diff_col;
    uVar2 = uVar2 + diff_row;
  } while (bVar10);
  return 4 < iVar6;
}

Assistant:

bool check_single(char chesses[], int row, int col, int diff_row, int diff_col) {
    int link_num = 1;
    for (int i = 1; i < 5; i++) {
        int tmp_row = row - diff_row * i;
        int tmp_col = col - diff_col * i;
        if (tmp_row <= 0 || tmp_row > 15 || tmp_col <= 0 || tmp_col > 15) {
            break;
        }
        if (!check_color(chesses, row, col, tmp_row, tmp_col)) {
            break; 
        }
        link_num += 1;
    }

    for (int i = 1; i < 5; i++) {
        int tmp_row = row + diff_row * i;
        int tmp_col = row + diff_col * i;
        if (tmp_row <= 0 || tmp_row > 15 || tmp_col <= 0 || tmp_col > 15) {
            break;
        }
        if (!check_color(chesses, row, col, tmp_row, tmp_col)) {
            break;
        }
        link_num += 1;
    }
    return link_num >= 5;
}